

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RowSetTest(RowSet *pRowSet,int iBatch,sqlite3_int64 iRowid)

{
  RowSetEntry **ppFirst;
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  RowSetEntry *pTail;
  RowSetEntry *pAux;
  RowSetEntry **ppPrevTree;
  RowSetEntry *pTree;
  RowSetEntry *p;
  RowSetEntry *in_stack_00000100;
  RowSet *in_stack_ffffffffffffffb8;
  RowSetEntry *in_stack_ffffffffffffffc0;
  long lVar3;
  RowSetEntry *local_28;
  
  if (in_ESI != *(int *)(in_RDI + 0x34)) {
    local_28 = *(RowSetEntry **)(in_RDI + 0x10);
    if (local_28 != (RowSetEntry *)0x0) {
      ppFirst = (RowSetEntry **)(in_RDI + 0x28);
      if ((*(ushort *)(in_RDI + 0x32) & 1) == 0) {
        local_28 = rowSetEntrySort(in_stack_00000100);
      }
      for (pRVar2 = *(RowSetEntry **)(in_RDI + 0x28); pRVar2 != (RowSetEntry *)0x0;
          pRVar2 = pRVar2->pRight) {
        ppFirst = &pRVar2->pRight;
        if (pRVar2->pLeft == (RowSetEntry *)0x0) {
          pRVar1 = rowSetListToTree(pRVar2);
          pRVar2->pLeft = pRVar1;
          break;
        }
        rowSetTreeToList(pRVar2,ppFirst,(RowSetEntry **)in_stack_ffffffffffffffc0);
        pRVar2->pLeft = (RowSetEntry *)0x0;
        local_28 = rowSetEntryMerge(in_stack_ffffffffffffffc0,local_28);
      }
      if (pRVar2 == (RowSetEntry *)0x0) {
        pRVar2 = rowSetEntryAlloc(in_stack_ffffffffffffffb8);
        *ppFirst = pRVar2;
        if (pRVar2 != (RowSetEntry *)0x0) {
          pRVar2->v = 0;
          pRVar2->pRight = (RowSetEntry *)0x0;
          pRVar1 = rowSetListToTree(pRVar2);
          pRVar2->pLeft = pRVar1;
        }
      }
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      *(ushort *)(in_RDI + 0x32) = *(ushort *)(in_RDI + 0x32) | 1;
    }
    *(int *)(in_RDI + 0x34) = in_ESI;
  }
  lVar3 = *(long *)(in_RDI + 0x28);
  do {
    if (lVar3 == 0) {
      return 0;
    }
    local_28 = *(RowSetEntry **)(lVar3 + 0x10);
    while (local_28 != (RowSetEntry *)0x0) {
      if (local_28->v < in_RDX) {
        local_28 = *(RowSetEntry **)((long)local_28 + 8);
      }
      else {
        if (local_28->v <= in_RDX) {
          return 1;
        }
        local_28 = *(RowSetEntry **)((long)local_28 + 0x10);
      }
    }
    lVar3 = *(long *)(lVar3 + 8);
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetTest(RowSet *pRowSet, int iBatch, sqlite3_int64 iRowid){
  struct RowSetEntry *p, *pTree;

  /* This routine is never called after sqlite3RowSetNext() */
  assert( pRowSet!=0 && (pRowSet->rsFlags & ROWSET_NEXT)==0 );

  /* Sort entries into the forest on the first test of a new batch 
  */
  if( iBatch!=pRowSet->iBatch ){
    p = pRowSet->pEntry;
    if( p ){
      struct RowSetEntry **ppPrevTree = &pRowSet->pForest;
      if( (pRowSet->rsFlags & ROWSET_SORTED)==0 ){
        p = rowSetEntrySort(p);
      }
      for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
        ppPrevTree = &pTree->pRight;
        if( pTree->pLeft==0 ){
          pTree->pLeft = rowSetListToTree(p);
          break;
        }else{
          struct RowSetEntry *pAux, *pTail;
          rowSetTreeToList(pTree->pLeft, &pAux, &pTail);
          pTree->pLeft = 0;
          p = rowSetEntryMerge(pAux, p);
        }
      }
      if( pTree==0 ){
        *ppPrevTree = pTree = rowSetEntryAlloc(pRowSet);
        if( pTree ){
          pTree->v = 0;
          pTree->pRight = 0;
          pTree->pLeft = rowSetListToTree(p);
        }
      }
      pRowSet->pEntry = 0;
      pRowSet->pLast = 0;
      pRowSet->rsFlags |= ROWSET_SORTED;
    }
    pRowSet->iBatch = iBatch;
  }

  /* Test to see if the iRowid value appears anywhere in the forest.
  ** Return 1 if it does and 0 if not.
  */
  for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
    p = pTree->pLeft;
    while( p ){
      if( p->v<iRowid ){
        p = p->pRight;
      }else if( p->v>iRowid ){
        p = p->pLeft;
      }else{
        return 1;
      }
    }
  }
  return 0;
}